

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::AddJoin(Clipper *this,TEdge *e1,TEdge *e2,int e1OutIdx,int e2OutIdx)

{
  long64 lVar1;
  JoinRec *jr;
  
  jr = (JoinRec *)operator_new(0x50);
  if (e1OutIdx < 0) {
    e1OutIdx = e1->outIdx;
  }
  jr->poly1Idx = e1OutIdx;
  lVar1 = e1->ycurr;
  (jr->pt1a).X = e1->xcurr;
  (jr->pt1a).Y = lVar1;
  lVar1 = e1->ytop;
  (jr->pt1b).X = e1->xtop;
  (jr->pt1b).Y = lVar1;
  if (e2OutIdx < 0) {
    e2OutIdx = e2->outIdx;
  }
  jr->poly2Idx = e2OutIdx;
  lVar1 = e2->ycurr;
  (jr->pt2a).X = e2->xcurr;
  (jr->pt2a).Y = lVar1;
  lVar1 = e2->ytop;
  (jr->pt2b).X = e2->xtop;
  (jr->pt2b).Y = lVar1;
  std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::push_back
            (&this->m_Joins,&jr);
  return;
}

Assistant:

void Clipper::AddJoin(TEdge *e1, TEdge *e2, int e1OutIdx, int e2OutIdx)
{
  JoinRec* jr = new JoinRec;
  if (e1OutIdx >= 0)
    jr->poly1Idx = e1OutIdx; else
    jr->poly1Idx = e1->outIdx;
  jr->pt1a = IntPoint(e1->xcurr, e1->ycurr);
  jr->pt1b = IntPoint(e1->xtop, e1->ytop);
  if (e2OutIdx >= 0)
    jr->poly2Idx = e2OutIdx; else
    jr->poly2Idx = e2->outIdx;
  jr->pt2a = IntPoint(e2->xcurr, e2->ycurr);
  jr->pt2b = IntPoint(e2->xtop, e2->ytop);
  m_Joins.push_back(jr);
}